

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_fma_functor::unary_op_log>(Mat *a,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [24];
  long *in_RDI;
  float fVar55;
  undefined1 auVar56 [32];
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_log op;
  Mat *m;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  __m256i ret_1;
  __m128i y2;
  __m128i y1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf y_1;
  v4sf z_1;
  v4sf tmp_1;
  v4sf mask_1;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_1;
  v4si emm0;
  undefined8 local_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  int local_149c;
  undefined8 local_1498;
  undefined8 local_1490;
  undefined8 local_1488;
  undefined4 local_1480;
  long local_1478;
  undefined4 local_1470;
  undefined4 local_146c;
  undefined4 local_1468;
  undefined4 local_1464;
  undefined4 local_1460;
  undefined8 local_1458;
  undefined1 (*local_1450) [32];
  int local_1448;
  int local_1444;
  int local_1440;
  int local_143c;
  int local_1438;
  int local_1434;
  int local_1430;
  undefined1 local_1429 [9];
  long *local_1420;
  undefined1 local_1415;
  int local_1414;
  undefined8 *local_1408;
  undefined8 *local_1400;
  undefined8 *local_13f0;
  undefined1 (*local_13e8) [32];
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined1 (*local_13b0) [32];
  undefined1 (*local_13a8) [32];
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined1 (*local_1390) [32];
  long local_1388;
  undefined4 local_137c;
  long local_1378;
  undefined1 (*local_1370) [32];
  undefined4 local_1364;
  int local_1360;
  int local_135c;
  undefined8 *local_1358;
  undefined4 local_134c;
  long local_1348;
  undefined8 *local_1338;
  undefined8 *local_1310;
  undefined1 *local_1308;
  undefined8 *local_1300;
  undefined1 *local_12f8;
  undefined1 (*local_12f0) [32];
  undefined1 *local_12e8;
  undefined1 local_12e0 [8];
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  ulong uStack_12c8;
  float local_12c0;
  float fStack_12bc;
  float fStack_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [8];
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined1 local_1240 [32];
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined1 local_11e0 [8];
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  ulong uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined1 *local_f48;
  float *local_f40;
  undefined1 *local_f38;
  undefined1 *local_f30;
  float *local_f28;
  undefined1 *local_f20;
  float *local_f18;
  undefined1 *local_f10;
  undefined1 *local_f08;
  float *local_f00;
  undefined1 *local_ef8;
  undefined1 *local_ef0;
  float *local_ee8;
  undefined1 *local_ee0;
  undefined1 *local_ed8;
  float *local_ed0;
  undefined1 *local_ec8;
  undefined1 *local_ec0;
  float *local_eb8;
  undefined1 *local_eb0;
  undefined1 *local_ea8;
  float *local_ea0;
  undefined1 *local_e98;
  undefined1 *local_e90;
  float *local_e88;
  undefined1 *local_e80;
  undefined1 *local_e78;
  float *local_e70;
  undefined1 *local_e68;
  undefined1 *local_e60;
  undefined1 *local_e58;
  float *local_e50;
  float *local_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  float local_d80 [2];
  float afStack_d78 [2];
  float afStack_d70 [2];
  float afStack_d68 [2];
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  float local_d20 [2];
  float afStack_d18 [2];
  float afStack_d10 [2];
  float afStack_d08 [2];
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  float local_cc0 [2];
  float afStack_cb8 [2];
  float afStack_cb0 [2];
  float afStack_ca8 [2];
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  float local_c60 [2];
  float afStack_c58 [2];
  float afStack_c50 [2];
  float afStack_c48 [2];
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  float local_c00 [2];
  float afStack_bf8 [2];
  float afStack_bf0 [2];
  float afStack_be8 [2];
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  float local_ba0 [2];
  float afStack_b98 [2];
  float afStack_b90 [2];
  float afStack_b88 [2];
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  float local_b40 [2];
  float afStack_b38 [2];
  float afStack_b30 [2];
  float afStack_b28 [2];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float local_ae0 [2];
  float afStack_ad8 [2];
  float afStack_ad0 [2];
  float afStack_ac8 [2];
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  ulong uStack_a68;
  float local_a60 [2];
  float afStack_a58 [2];
  float afStack_a50 [2];
  float afStack_a48 [2];
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  float local_a00 [2];
  float afStack_9f8 [2];
  float afStack_9f0 [2];
  float afStack_9e8 [2];
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  float local_9a0 [2];
  float afStack_998 [2];
  float afStack_990 [2];
  float afStack_988 [2];
  ulong local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  undefined4 local_8c4;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined4 local_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined4 local_6a4;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined1 local_650 [8];
  undefined8 uStack_648;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined1 local_610 [8];
  undefined8 uStack_608;
  undefined1 local_600 [16];
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [8];
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined1 local_560 [16];
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined1 local_520 [16];
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined1 *local_418;
  float *local_410;
  float *local_408;
  undefined1 *local_400;
  float *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  float *local_3e0;
  undefined1 *local_3d8;
  float *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  float *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  float *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  float *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  float *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  float *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  float *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  float *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  undefined8 local_310;
  undefined8 uStack_308;
  float local_300 [2];
  float afStack_2f8 [2];
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  float local_2e0 [2];
  float afStack_2d8 [2];
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  float local_2b0 [2];
  float afStack_2a8 [2];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  float local_280 [2];
  float afStack_278 [2];
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  float local_250 [2];
  float afStack_248 [2];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  float local_220 [2];
  float afStack_218 [2];
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  float local_1f0 [2];
  float afStack_1e8 [2];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1c0 [2];
  float afStack_1b8 [2];
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  float local_190 [2];
  float afStack_188 [2];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  float local_150 [2];
  float afStack_148 [2];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  float local_120 [2];
  float afStack_118 [2];
  undefined8 local_110;
  undefined8 uStack_108;
  undefined4 local_f4;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  ulong uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_1430 = *(int *)((long)in_RDI + 0x2c);
  local_1434 = (int)in_RDI[6];
  local_1438 = *(int *)((long)in_RDI + 0x34);
  local_143c = (int)in_RDI[7];
  local_1440 = (int)in_RDI[3];
  local_1444 = local_1430 * local_1434 * local_1438 * local_1440;
  local_1420 = in_RDI;
  for (local_1448 = 0; local_1448 < local_143c; local_1448 = local_1448 + 1) {
    local_1408 = &local_1498;
    local_135c = *(int *)((long)local_1420 + 0x2c);
    local_1360 = (int)local_1420[6];
    local_1364 = *(undefined4 *)((long)local_1420 + 0x34);
    local_1370 = (undefined1 (*) [32])
                 (*local_1420 + local_1420[8] * (long)local_1448 * local_1420[2]);
    local_1378 = local_1420[2];
    local_137c = (undefined4)local_1420[3];
    local_1388 = local_1420[4];
    local_1358 = &local_1498;
    local_1348 = (long)local_135c * (long)local_1360 * local_1378;
    local_1400 = &local_1498;
    local_13f0 = &local_1498;
    local_134c = 0x10;
    local_1414 = local_1448;
    local_1415 = 1;
    local_1498 = 0;
    local_1488 = 0;
    local_1480 = 0;
    local_1470 = 0;
    local_146c = 0;
    local_1468 = 0;
    local_1464 = 0;
    local_1460 = 0;
    local_1458 = 0;
    local_1490 = 0;
    local_1450 = local_1370;
    for (local_149c = 0; local_149c + 7 < local_1444; local_149c = local_149c + 8) {
      local_13e8 = local_1450;
      uStack_f70 = *(undefined8 *)(*local_1450 + 0x10);
      uStack_f68 = *(undefined8 *)(*local_1450 + 0x18);
      local_1308 = local_1429;
      local_1310 = &local_14c0;
      local_1220 = 0x3f8000003f800000;
      uStack_1218 = 0x3f8000003f800000;
      uStack_1210 = 0x3f8000003f800000;
      uStack_1208 = 0x3f8000003f800000;
      local_1080 = 0;
      uStack_1078 = 0;
      uStack_1070 = 0;
      uStack_1068 = 0;
      local_1240 = vcmpps_avx(*local_1450,ZEXT1632(ZEXT816(0)),2);
      local_11e0 = SUB168(*(undefined1 (*) [16])*local_1450,0);
      local_f80 = local_11e0;
      uStack_11d8 = SUB168(*(undefined1 (*) [16])*local_1450,8);
      uStack_f78 = uStack_11d8;
      local_fa0 = 0x80000000800000;
      uStack_f98 = 0x80000000800000;
      uStack_f90 = 0x80000000800000;
      uStack_f88 = 0x80000000800000;
      auVar20._8_8_ = 0x80000000800000;
      auVar20._0_8_ = 0x80000000800000;
      auVar20._16_8_ = 0x80000000800000;
      auVar20._24_8_ = 0x80000000800000;
      auVar1 = vmaxps_avx(*local_1450,auVar20);
      local_11e0 = auVar1._0_8_;
      local_8a0 = local_11e0;
      uStack_11d8 = auVar1._8_8_;
      uStack_898 = uStack_11d8;
      uStack_11d0 = auVar1._16_8_;
      uStack_890 = uStack_11d0;
      uStack_11c8 = auVar1._24_8_;
      uStack_888 = uStack_11c8;
      local_8c0 = local_11e0;
      uStack_8b8 = uStack_11d8;
      uStack_8b0 = uStack_11d0;
      uStack_8a8 = uStack_11c8;
      local_8c4 = 0x17;
      local_940 = local_11e0;
      uStack_938 = uStack_11d8;
      uStack_930 = uStack_11d0;
      uStack_928 = uStack_11c8;
      local_6a0 = local_11e0;
      uStack_698 = uStack_11d8;
      local_6a4 = 0x17;
      local_8e0 = vpsrld_avx(auVar1._0_16_,ZEXT416(0x17));
      local_6c0 = uStack_11d0;
      uStack_6b8 = uStack_11c8;
      local_6c4 = 0x17;
      local_8f0 = vpsrld_avx(auVar1._16_16_,ZEXT416(0x17));
      local_960 = local_8e0._0_8_;
      uStack_958 = local_8e0._8_8_;
      uStack_950 = local_8f0._0_8_;
      uStack_948 = local_8f0._8_8_;
      local_920 = local_8e0._0_8_;
      uStack_918 = local_8e0._8_8_;
      uStack_910 = local_8f0._0_8_;
      uStack_908 = local_8f0._8_8_;
      local_1120 = local_11e0;
      uStack_1118 = uStack_11d8;
      uStack_1110 = uStack_11d0;
      uStack_1108 = uStack_11c8;
      local_1140 = 0x807fffff807fffff;
      uStack_1138 = 0x807fffff807fffff;
      uStack_1130 = 0x807fffff807fffff;
      uStack_1128 = 0x807fffff807fffff;
      auVar18._8_8_ = 0x807fffff807fffff;
      auVar18._0_8_ = 0x807fffff807fffff;
      auVar18._16_8_ = 0x807fffff807fffff;
      auVar18._24_8_ = 0x807fffff807fffff;
      auVar1 = vandps_avx(auVar1,auVar18);
      local_11e0 = auVar1._0_8_;
      local_820 = local_11e0;
      uStack_11d8 = auVar1._8_8_;
      uStack_818 = uStack_11d8;
      uStack_11d0 = auVar1._16_8_;
      uStack_810 = uStack_11d0;
      uStack_11c8 = auVar1._24_8_;
      uStack_808 = uStack_11c8;
      local_840 = 0x3f0000003f000000;
      uStack_838 = 0x3f0000003f000000;
      uStack_830 = 0x3f0000003f000000;
      uStack_828 = 0x3f0000003f000000;
      auVar32._8_8_ = 0x3f0000003f000000;
      auVar32._0_8_ = 0x3f0000003f000000;
      auVar32._16_8_ = 0x3f0000003f000000;
      auVar32._24_8_ = 0x3f0000003f000000;
      auVar2 = vorps_avx(auVar1,auVar32);
      local_720 = local_8e0._0_8_;
      uStack_718 = local_8e0._8_8_;
      uStack_710 = local_8f0._0_8_;
      uStack_708 = local_8f0._8_8_;
      local_740 = 0x7f0000007f;
      uStack_738 = 0x7f0000007f;
      uStack_730 = 0x7f0000007f;
      uStack_728 = 0x7f0000007f;
      local_7c0 = local_8e0._0_8_;
      uStack_7b8 = local_8e0._8_8_;
      uStack_7b0 = local_8f0._0_8_;
      uStack_7a8 = local_8f0._8_8_;
      local_7e0 = 0x7f0000007f;
      uStack_7d8 = 0x7f0000007f;
      uStack_7d0 = 0x7f0000007f;
      uStack_7c8 = 0x7f0000007f;
      local_770 = 0x7f0000007f;
      uStack_768 = 0x7f0000007f;
      local_780 = 0x7f0000007f;
      uStack_778 = 0x7f0000007f;
      local_660 = local_8e0._0_8_;
      uStack_658 = local_8e0._8_8_;
      local_670 = 0x7f0000007f;
      uStack_668 = 0x7f0000007f;
      auVar3._8_8_ = 0x7f0000007f;
      auVar3._0_8_ = 0x7f0000007f;
      local_750 = vpsubd_avx(local_8e0,auVar3);
      local_680 = local_8f0._0_8_;
      uStack_678 = local_8f0._8_8_;
      local_690 = 0x7f0000007f;
      uStack_688 = 0x7f0000007f;
      auVar5._8_8_ = 0x7f0000007f;
      auVar5._0_8_ = 0x7f0000007f;
      local_760 = vpsubd_avx(local_8f0,auVar5);
      local_800 = local_750._0_8_;
      uStack_7f8 = local_750._8_8_;
      uStack_7f0 = local_760._0_8_;
      uStack_7e8 = local_760._8_8_;
      local_7a0 = local_750._0_8_;
      uStack_798 = local_750._8_8_;
      uStack_790 = local_760._0_8_;
      uStack_788 = local_760._8_8_;
      local_1200 = local_750._0_8_;
      uStack_11f8 = local_750._8_8_;
      uStack_11f0 = local_760._0_8_;
      uStack_11e8 = local_760._8_8_;
      local_700 = local_750._0_8_;
      uStack_6f8 = local_750._8_8_;
      uStack_6f0 = local_760._0_8_;
      uStack_6e8 = local_760._8_8_;
      auVar33._16_8_ = local_760._0_8_;
      auVar33._0_16_ = local_750;
      auVar33._24_8_ = local_760._8_8_;
      auVar1 = vcvtdq2ps_avx(auVar33);
      local_1260 = auVar1._0_8_;
      uVar6 = local_1260;
      uStack_1258 = auVar1._8_8_;
      uVar7 = uStack_1258;
      uStack_1250 = auVar1._16_8_;
      uVar8 = uStack_1250;
      uStack_1248 = auVar1._24_8_;
      uVar9 = uStack_1248;
      local_dc0 = 0x3f8000003f800000;
      uStack_db8 = 0x3f8000003f800000;
      uStack_db0 = 0x3f8000003f800000;
      uStack_da8 = 0x3f8000003f800000;
      local_da0._0_4_ = auVar1._0_4_;
      local_da0._4_4_ = auVar1._4_4_;
      uStack_d98._0_4_ = auVar1._8_4_;
      uStack_d98._4_4_ = auVar1._12_4_;
      uStack_d90._0_4_ = auVar1._16_4_;
      uStack_d90._4_4_ = auVar1._20_4_;
      uStack_d88._0_4_ = auVar1._24_4_;
      uStack_d88._4_4_ = auVar1._28_4_;
      local_1260._4_4_ = local_da0._4_4_ + 1.0;
      local_1260._0_4_ = (float)local_da0 + 1.0;
      uStack_1258._0_4_ = (float)uStack_d98 + 1.0;
      uStack_1258._4_4_ = uStack_d98._4_4_ + 1.0;
      uStack_1250._0_4_ = (float)uStack_d90 + 1.0;
      uStack_1250._4_4_ = uStack_d90._4_4_ + 1.0;
      auVar54 = _local_1260;
      uStack_1248._0_4_ = (float)uStack_d88 + 1.0;
      uStack_1248._4_4_ = uStack_d88._4_4_ + 1.0;
      auVar18 = _local_1260;
      local_1280 = vcmpps_avx(auVar2,_DAT_01f92720,1);
      local_11e0 = auVar2._0_8_;
      local_1160 = local_11e0;
      uStack_11d8 = auVar2._8_8_;
      uStack_1158 = uStack_11d8;
      uStack_11d0 = auVar2._16_8_;
      uStack_1150 = uStack_11d0;
      uStack_11c8 = auVar2._24_8_;
      uStack_1148 = uStack_11c8;
      local_1180 = local_1280._0_8_;
      uStack_1178 = local_1280._8_8_;
      uStack_1170 = local_1280._16_8_;
      uStack_1168 = local_1280._24_8_;
      local_12a0 = vandps_avx(auVar2,local_1280);
      local_10a0 = local_11e0;
      uStack_1098 = uStack_11d8;
      uStack_1090 = uStack_11d0;
      uStack_1088 = uStack_11c8;
      local_10c0 = 0x3f8000003f800000;
      uStack_10b8 = 0x3f8000003f800000;
      uStack_10b0 = 0x3f8000003f800000;
      uStack_10a8 = 0x3f8000003f800000;
      auVar1._8_8_ = 0x3f8000003f800000;
      auVar1._0_8_ = 0x3f8000003f800000;
      auVar1._16_8_ = 0x3f8000003f800000;
      auVar1._24_8_ = 0x3f8000003f800000;
      auVar1 = vsubps_avx(auVar2,auVar1);
      local_10e0 = local_1260;
      uStack_10d8 = uStack_1258;
      uStack_1250 = auVar54._16_8_;
      uStack_10d0 = uStack_1250;
      uStack_1248 = auVar18._24_8_;
      uStack_10c8 = uStack_1248;
      local_11a0 = 0x3f8000003f800000;
      uStack_1198 = 0x3f8000003f800000;
      uStack_1190 = 0x3f8000003f800000;
      uStack_1188 = 0x3f8000003f800000;
      local_11c0 = local_1280._0_8_;
      uStack_11b8 = local_1280._8_8_;
      uStack_11b0 = local_1280._16_8_;
      uStack_11a8 = local_1280._24_8_;
      auVar2._8_8_ = 0x3f8000003f800000;
      auVar2._0_8_ = 0x3f8000003f800000;
      auVar2._16_8_ = 0x3f8000003f800000;
      auVar2._24_8_ = 0x3f8000003f800000;
      local_1100 = vandps_avx(auVar2,local_1280);
      auVar19._16_8_ = uStack_1250;
      auVar19._0_16_ = _local_1260;
      auVar19._24_8_ = uStack_1248;
      _local_1260 = vsubps_avx(auVar19,local_1100);
      local_11e0 = auVar1._0_8_;
      uVar10 = local_11e0;
      uStack_11d8 = auVar1._8_8_;
      uVar11 = uStack_11d8;
      uStack_11d0 = auVar1._16_8_;
      uVar12 = uStack_11d0;
      uStack_11c8 = auVar1._24_8_;
      uVar13 = uStack_11c8;
      local_de0._0_4_ = auVar1._0_4_;
      local_de0._4_4_ = auVar1._4_4_;
      uStack_dd8._0_4_ = auVar1._8_4_;
      uStack_dd8._4_4_ = auVar1._12_4_;
      uStack_dd0._0_4_ = auVar1._16_4_;
      uStack_dd0._4_4_ = auVar1._20_4_;
      uStack_dc8._0_4_ = auVar1._24_4_;
      uStack_dc8._4_4_ = auVar1._28_4_;
      local_e00._0_4_ = local_12a0._0_4_;
      local_e00._4_4_ = local_12a0._4_4_;
      uStack_df8._0_4_ = local_12a0._8_4_;
      uStack_df8._4_4_ = local_12a0._12_4_;
      uStack_df0._0_4_ = local_12a0._16_4_;
      uStack_df0._4_4_ = local_12a0._20_4_;
      uStack_de8._0_4_ = local_12a0._24_4_;
      uStack_de8._4_4_ = local_12a0._28_4_;
      local_11e0._0_4_ = (float)local_de0 + (float)local_e00;
      local_11e0._4_4_ = local_de0._4_4_ + local_e00._4_4_;
      uStack_dd8._0_4_ = (float)uStack_dd8 + (float)uStack_df8;
      uStack_dd8._4_4_ = uStack_dd8._4_4_ + uStack_df8._4_4_;
      uStack_dd0._0_4_ = (float)uStack_dd0 + (float)uStack_df0;
      uStack_dd0._4_4_ = uStack_dd0._4_4_ + uStack_df0._4_4_;
      uStack_dc8._0_4_ = (float)uStack_dc8 + (float)uStack_de8;
      fStack_12a4 = uStack_dc8._4_4_ + uStack_de8._4_4_;
      uStack_11d8._0_4_ = (float)uStack_dd8;
      uStack_11d8._4_4_ = uStack_dd8._4_4_;
      uStack_11d0._0_4_ = (float)uStack_dd0;
      uStack_11d0._4_4_ = uStack_dd0._4_4_;
      auVar54 = _local_11e0;
      uStack_11c8._0_4_ = (float)uStack_dc8;
      uStack_11c8._4_4_ = fStack_12a4;
      auVar1 = _local_11e0;
      local_fe0 = local_11e0;
      uStack_fd8 = uStack_11d8;
      uStack_11d0 = auVar54._16_8_;
      uStack_fd0 = uStack_11d0;
      uStack_11c8 = auVar1._24_8_;
      uStack_fc8 = uStack_11c8;
      local_12c0 = (float)local_11e0._0_4_ * (float)local_11e0._0_4_;
      fStack_12bc = (float)local_11e0._4_4_ * (float)local_11e0._4_4_;
      fStack_12b8 = (float)uStack_dd8 * (float)uStack_dd8;
      fStack_12b4 = uStack_dd8._4_4_ * uStack_dd8._4_4_;
      fStack_12b0 = (float)uStack_dd0 * (float)uStack_dd0;
      fStack_12ac = uStack_dd0._4_4_ * uStack_dd0._4_4_;
      fStack_12a8 = (float)uStack_dc8 * (float)uStack_dc8;
      uStack_12d8 = 0x3d9021bb3d9021bb;
      local_12e0 = (undefined1  [8])0x3d9021bb3d9021bb;
      uStack_12d0 = 0x3d9021bb3d9021bb;
      uStack_12c8 = 0x3d9021bb3d9021bb;
      local_f30 = local_12e0;
      local_f10 = local_11e0;
      local_e70 = ::_ps256_cephes_log_p1;
      local_d40 = 0x3d9021bb3d9021bb;
      uStack_d38 = 0x3d9021bb3d9021bb;
      uStack_d30 = 0x3d9021bb3d9021bb;
      uStack_d28 = 0x3d9021bb3d9021bb;
      local_d60 = local_11e0;
      uStack_d58 = uStack_11d8;
      uStack_d50 = uStack_11d0;
      uStack_d48 = uStack_11c8;
      local_d80[0] = -0.1151461;
      local_d80[1] = -0.1151461;
      afStack_d78[0] = -0.1151461;
      afStack_d78[1] = -0.1151461;
      afStack_d70[0] = -0.1151461;
      afStack_d70[1] = -0.1151461;
      afStack_d68[0] = -0.1151461;
      afStack_d68[1] = -0.1151461;
      auVar21._8_4_ = -0.1151461;
      auVar21._12_4_ = -0.1151461;
      auVar21._0_4_ = -0.1151461;
      auVar21._4_4_ = -0.1151461;
      auVar21._16_4_ = -0.1151461;
      auVar21._20_4_ = -0.1151461;
      auVar21._24_4_ = -0.1151461;
      auVar21._28_4_ = -0.1151461;
      auVar5 = vfmadd213ps_fma(auVar1,_local_12e0,auVar21);
      local_e88 = ::_ps256_cephes_log_p2;
      local_12e0 = auVar5._0_8_;
      local_ce0 = local_12e0;
      uStack_12d8 = auVar5._8_8_;
      uStack_cd8 = uStack_12d8;
      uStack_cd0 = 0;
      uStack_cc8 = 0;
      local_d00 = local_11e0;
      uStack_cf8 = uStack_11d8;
      uStack_cf0 = uStack_11d0;
      uStack_ce8 = uStack_11c8;
      local_d20[0] = 0.116769984;
      local_d20[1] = 0.116769984;
      afStack_d18[0] = 0.116769984;
      afStack_d18[1] = 0.116769984;
      afStack_d10[0] = 0.116769984;
      afStack_d10[1] = 0.116769984;
      afStack_d08[0] = 0.116769984;
      afStack_d08[1] = 0.116769984;
      auVar22._8_4_ = 0.116769984;
      auVar22._12_4_ = 0.116769984;
      auVar22._0_4_ = 0.116769984;
      auVar22._4_4_ = 0.116769984;
      auVar22._16_4_ = 0.116769984;
      auVar22._20_4_ = 0.116769984;
      auVar22._24_4_ = 0.116769984;
      auVar22._28_4_ = 0.116769984;
      auVar5 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar5),auVar22);
      local_ea0 = ::_ps256_cephes_log_p3;
      local_12e0 = auVar5._0_8_;
      local_c80 = local_12e0;
      uStack_12d8 = auVar5._8_8_;
      uStack_c78 = uStack_12d8;
      uStack_c70 = 0;
      uStack_c68 = 0;
      local_ca0 = local_11e0;
      uStack_c98 = uStack_11d8;
      uStack_c90 = uStack_11d0;
      uStack_c88 = uStack_11c8;
      local_cc0[0] = -0.12420141;
      local_cc0[1] = -0.12420141;
      afStack_cb8[0] = -0.12420141;
      afStack_cb8[1] = -0.12420141;
      afStack_cb0[0] = -0.12420141;
      afStack_cb0[1] = -0.12420141;
      afStack_ca8[0] = -0.12420141;
      afStack_ca8[1] = -0.12420141;
      auVar23._8_4_ = -0.12420141;
      auVar23._12_4_ = -0.12420141;
      auVar23._0_4_ = -0.12420141;
      auVar23._4_4_ = -0.12420141;
      auVar23._16_4_ = -0.12420141;
      auVar23._20_4_ = -0.12420141;
      auVar23._24_4_ = -0.12420141;
      auVar23._28_4_ = -0.12420141;
      auVar5 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar5),auVar23);
      local_eb8 = ::_ps256_cephes_log_p4;
      local_12e0 = auVar5._0_8_;
      local_c20 = local_12e0;
      uStack_12d8 = auVar5._8_8_;
      uStack_c18 = uStack_12d8;
      uStack_c10 = 0;
      uStack_c08 = 0;
      local_c40 = local_11e0;
      uStack_c38 = uStack_11d8;
      uStack_c30 = uStack_11d0;
      uStack_c28 = uStack_11c8;
      local_c60[0] = 0.14249323;
      local_c60[1] = 0.14249323;
      afStack_c58[0] = 0.14249323;
      afStack_c58[1] = 0.14249323;
      afStack_c50[0] = 0.14249323;
      afStack_c50[1] = 0.14249323;
      afStack_c48[0] = 0.14249323;
      afStack_c48[1] = 0.14249323;
      auVar24._8_4_ = 0.14249323;
      auVar24._12_4_ = 0.14249323;
      auVar24._0_4_ = 0.14249323;
      auVar24._4_4_ = 0.14249323;
      auVar24._16_4_ = 0.14249323;
      auVar24._20_4_ = 0.14249323;
      auVar24._24_4_ = 0.14249323;
      auVar24._28_4_ = 0.14249323;
      auVar5 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar5),auVar24);
      local_ed0 = ::_ps256_cephes_log_p5;
      local_12e0 = auVar5._0_8_;
      local_bc0 = local_12e0;
      uStack_12d8 = auVar5._8_8_;
      uStack_bb8 = uStack_12d8;
      uStack_bb0 = 0;
      uStack_ba8 = 0;
      local_be0 = local_11e0;
      uStack_bd8 = uStack_11d8;
      uStack_bd0 = uStack_11d0;
      uStack_bc8 = uStack_11c8;
      local_c00[0] = -0.16668057;
      local_c00[1] = -0.16668057;
      afStack_bf8[0] = -0.16668057;
      afStack_bf8[1] = -0.16668057;
      afStack_bf0[0] = -0.16668057;
      afStack_bf0[1] = -0.16668057;
      afStack_be8[0] = -0.16668057;
      afStack_be8[1] = -0.16668057;
      auVar25._8_4_ = -0.16668057;
      auVar25._12_4_ = -0.16668057;
      auVar25._0_4_ = -0.16668057;
      auVar25._4_4_ = -0.16668057;
      auVar25._16_4_ = -0.16668057;
      auVar25._20_4_ = -0.16668057;
      auVar25._24_4_ = -0.16668057;
      auVar25._28_4_ = -0.16668057;
      auVar5 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar5),auVar25);
      local_ee8 = ::_ps256_cephes_log_p6;
      local_12e0 = auVar5._0_8_;
      local_b60 = local_12e0;
      uStack_12d8 = auVar5._8_8_;
      uStack_b58 = uStack_12d8;
      uStack_b50 = 0;
      uStack_b48 = 0;
      local_b80 = local_11e0;
      uStack_b78 = uStack_11d8;
      uStack_b70 = uStack_11d0;
      uStack_b68 = uStack_11c8;
      local_ba0[0] = 0.20000714;
      local_ba0[1] = 0.20000714;
      afStack_b98[0] = 0.20000714;
      afStack_b98[1] = 0.20000714;
      afStack_b90[0] = 0.20000714;
      afStack_b90[1] = 0.20000714;
      afStack_b88[0] = 0.20000714;
      afStack_b88[1] = 0.20000714;
      auVar26._8_4_ = 0.20000714;
      auVar26._12_4_ = 0.20000714;
      auVar26._0_4_ = 0.20000714;
      auVar26._4_4_ = 0.20000714;
      auVar26._16_4_ = 0.20000714;
      auVar26._20_4_ = 0.20000714;
      auVar26._24_4_ = 0.20000714;
      auVar26._28_4_ = 0.20000714;
      auVar5 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar5),auVar26);
      local_f00 = ::_ps256_cephes_log_p7;
      local_12e0 = auVar5._0_8_;
      local_b00 = local_12e0;
      uStack_12d8 = auVar5._8_8_;
      uStack_af8 = uStack_12d8;
      uStack_af0 = 0;
      uStack_ae8 = 0;
      local_b20 = local_11e0;
      uStack_b18 = uStack_11d8;
      uStack_b10 = uStack_11d0;
      uStack_b08 = uStack_11c8;
      local_b40[0] = -0.24999994;
      local_b40[1] = -0.24999994;
      afStack_b38[0] = -0.24999994;
      afStack_b38[1] = -0.24999994;
      afStack_b30[0] = -0.24999994;
      afStack_b30[1] = -0.24999994;
      afStack_b28[0] = -0.24999994;
      afStack_b28[1] = -0.24999994;
      auVar27._8_4_ = -0.24999994;
      auVar27._12_4_ = -0.24999994;
      auVar27._0_4_ = -0.24999994;
      auVar27._4_4_ = -0.24999994;
      auVar27._16_4_ = -0.24999994;
      auVar27._20_4_ = -0.24999994;
      auVar27._24_4_ = -0.24999994;
      auVar27._28_4_ = -0.24999994;
      auVar5 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar5),auVar27);
      local_f18 = ::_ps256_cephes_log_p8;
      local_12e0 = auVar5._0_8_;
      local_aa0 = local_12e0;
      uStack_12d8 = auVar5._8_8_;
      uStack_a98 = uStack_12d8;
      uStack_a90 = 0;
      uStack_a88 = 0;
      local_ac0 = local_11e0;
      uStack_ab8 = uStack_11d8;
      uStack_ab0 = uStack_11d0;
      uStack_aa8 = uStack_11c8;
      local_ae0[0] = 0.3333333;
      local_ae0[1] = 0.3333333;
      afStack_ad8[0] = 0.3333333;
      afStack_ad8[1] = 0.3333333;
      afStack_ad0[0] = 0.3333333;
      afStack_ad0[1] = 0.3333333;
      afStack_ac8[0] = 0.3333333;
      afStack_ac8[1] = 0.3333333;
      auVar28._8_4_ = 0.3333333;
      auVar28._12_4_ = 0.3333333;
      auVar28._0_4_ = 0.3333333;
      auVar28._4_4_ = 0.3333333;
      auVar28._16_4_ = 0.3333333;
      auVar28._20_4_ = 0.3333333;
      auVar28._24_4_ = 0.3333333;
      auVar28._28_4_ = 0.3333333;
      auVar5 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar5),auVar28);
      local_12e0 = auVar5._0_8_;
      uVar14 = local_12e0;
      uStack_12d8 = auVar5._8_8_;
      uVar15 = uStack_12d8;
      uStack_ff0 = 0;
      uStack_fe8 = 0;
      local_1020 = local_11e0;
      uStack_1018 = uStack_11d8;
      uStack_1010 = uStack_11d0;
      uStack_1008 = uStack_11c8;
      local_1000._0_4_ = auVar5._0_4_;
      local_1000._4_4_ = auVar5._4_4_;
      uStack_ff8._0_4_ = auVar5._8_4_;
      uStack_ff8._4_4_ = auVar5._12_4_;
      local_12e0._4_4_ = local_1000._4_4_ * (float)local_11e0._4_4_;
      local_12e0._0_4_ = (float)local_1000 * (float)local_11e0._0_4_;
      uStack_12d8._0_4_ = (float)uStack_ff8 * (float)uStack_dd8;
      uStack_12d8._4_4_ = uStack_ff8._4_4_ * uStack_dd8._4_4_;
      uStack_12d0._0_4_ = (float)uStack_dd0 * 0.0;
      uStack_12d0._4_4_ = uStack_dd0._4_4_ * 0.0;
      auVar54 = _local_12e0;
      local_1040 = local_12e0;
      uStack_1038 = uStack_12d8;
      uStack_12d0 = auVar54._16_8_;
      uStack_1030 = uStack_12d0;
      uStack_12c8 = (ulong)(uint)((float)uStack_dc8 * 0.0);
      uStack_1028 = uStack_12c8;
      local_1060 = CONCAT44(fStack_12bc,local_12c0);
      uStack_1058 = CONCAT44(fStack_12b4,fStack_12b8);
      uStack_1050 = CONCAT44(fStack_12ac,fStack_12b0);
      uStack_1048 = CONCAT44(fStack_12a4,fStack_12a8);
      uStack_12c8._0_4_ = (float)uStack_dc8 * 0.0 * fStack_12a8;
      local_12e0._4_4_ = local_1000._4_4_ * (float)local_11e0._4_4_ * fStack_12bc;
      local_12e0._0_4_ = (float)local_1000 * (float)local_11e0._0_4_ * local_12c0;
      uStack_12d8._0_4_ = (float)uStack_ff8 * (float)uStack_dd8 * fStack_12b8;
      uStack_12d8._4_4_ = uStack_ff8._4_4_ * uStack_dd8._4_4_ * fStack_12b4;
      uStack_12d0._0_4_ = (float)uStack_dd0 * 0.0 * fStack_12b0;
      uStack_12d0._4_4_ = uStack_dd0._4_4_ * 0.0 * fStack_12ac;
      auVar54 = _local_12e0;
      uStack_12c8._4_4_ = 0;
      auVar1 = _local_12e0;
      local_f20 = local_1260;
      local_f28 = ::_ps256_cephes_log_q1;
      local_a40 = local_1260;
      uStack_a38 = uStack_1258;
      uStack_a30 = uStack_1250;
      uStack_a28 = uStack_1248;
      local_a60[0] = -0.00021219444;
      local_a60[1] = -0.00021219444;
      afStack_a58[0] = -0.00021219444;
      afStack_a58[1] = -0.00021219444;
      afStack_a50[0] = -0.00021219444;
      afStack_a50[1] = -0.00021219444;
      afStack_a48[0] = -0.00021219444;
      afStack_a48[1] = -0.00021219444;
      local_a80 = local_12e0;
      uStack_a78 = uStack_12d8;
      uStack_12d0 = auVar54._16_8_;
      uStack_a70 = uStack_12d0;
      uStack_12c8 = (ulong)(uint)(float)uStack_12c8;
      uStack_a68 = uStack_12c8;
      auVar29._8_4_ = -0.00021219444;
      auVar29._12_4_ = -0.00021219444;
      auVar29._0_4_ = -0.00021219444;
      auVar29._4_4_ = -0.00021219444;
      auVar29._16_4_ = -0.00021219444;
      auVar29._20_4_ = -0.00021219444;
      auVar29._24_4_ = -0.00021219444;
      auVar29._28_4_ = -0.00021219444;
      auVar5 = vfmadd213ps_fma(auVar29,_local_1260,auVar1);
      local_e48 = &local_12c0;
      local_e50 = ::_ps256_0p5;
      local_980 = CONCAT44(fStack_12bc,local_12c0);
      uStack_978 = CONCAT44(fStack_12b4,fStack_12b8);
      uStack_970 = CONCAT44(fStack_12ac,fStack_12b0);
      uStack_968 = CONCAT44(fStack_12a4,fStack_12a8);
      local_9a0[0] = 0.5;
      local_9a0[1] = 0.5;
      afStack_998[0] = 0.5;
      afStack_998[1] = 0.5;
      afStack_990[0] = 0.5;
      afStack_990[1] = 0.5;
      afStack_988[0] = 0.5;
      afStack_988[1] = 0.5;
      local_12e0 = auVar5._0_8_;
      local_9c0 = local_12e0;
      uStack_12d8 = auVar5._8_8_;
      uStack_9b8 = uStack_12d8;
      uStack_9b0 = 0;
      uStack_9a8 = 0;
      auVar56._0_8_ = local_980 ^ 0x8000000080000000;
      auVar56._8_4_ = -fStack_12b8;
      auVar56._12_4_ = -fStack_12b4;
      auVar56._16_4_ = -fStack_12b0;
      auVar56._20_4_ = -fStack_12ac;
      auVar56._24_4_ = -fStack_12a8;
      auVar56._28_4_ = -fStack_12a4;
      auVar31._8_4_ = 0.5;
      auVar31._12_4_ = 0.5;
      auVar31._0_4_ = 0.5;
      auVar31._4_4_ = 0.5;
      auVar31._16_4_ = 0.5;
      auVar31._20_4_ = 0.5;
      auVar31._24_4_ = 0.5;
      auVar31._28_4_ = 0.5;
      auVar5 = vfmadd213ps_fma(auVar31,auVar56,ZEXT1632(auVar5));
      local_e20 = local_11e0;
      uStack_e18 = uStack_11d8;
      uStack_e10 = uStack_11d0;
      uStack_e08 = uStack_11c8;
      local_12e0 = auVar5._0_8_;
      uVar16 = local_12e0;
      uStack_12d8 = auVar5._8_8_;
      uVar17 = uStack_12d8;
      uStack_e30 = 0;
      uStack_e28 = 0;
      local_e40._0_4_ = auVar5._0_4_;
      local_e40._4_4_ = auVar5._4_4_;
      uStack_e38._0_4_ = auVar5._8_4_;
      uStack_e38._4_4_ = auVar5._12_4_;
      local_11e0._4_4_ = (float)local_11e0._4_4_ + local_e40._4_4_;
      local_11e0._0_4_ = (float)local_11e0._0_4_ + (float)local_e40;
      uStack_11d8._0_4_ = (float)uStack_dd8 + (float)uStack_e38;
      uStack_11d8._4_4_ = uStack_dd8._4_4_ + uStack_e38._4_4_;
      uStack_11d0._0_4_ = (float)uStack_dd0 + 0.0;
      uStack_11d0._4_4_ = uStack_dd0._4_4_ + 0.0;
      auVar54 = _local_11e0;
      uStack_11c8._0_4_ = (float)uStack_dc8 + 0.0;
      uStack_11c8._4_4_ = fStack_12a4 + 0.0;
      auVar1 = _local_11e0;
      local_f38 = local_1260;
      local_f40 = ::_ps256_cephes_log_q2;
      local_f48 = local_11e0;
      local_9e0 = local_1260;
      uStack_9d8 = uStack_1258;
      uStack_9d0 = uStack_1250;
      uStack_9c8 = uStack_1248;
      local_a00[0] = 0.6933594;
      local_a00[1] = 0.6933594;
      afStack_9f8[0] = 0.6933594;
      afStack_9f8[1] = 0.6933594;
      afStack_9f0[0] = 0.6933594;
      afStack_9f0[1] = 0.6933594;
      afStack_9e8[0] = 0.6933594;
      afStack_9e8[1] = 0.6933594;
      local_a20 = local_11e0;
      uStack_a18 = uStack_11d8;
      uStack_11d0 = auVar54._16_8_;
      uStack_a10 = uStack_11d0;
      uStack_11c8 = auVar1._24_8_;
      uStack_a08 = uStack_11c8;
      auVar30._8_4_ = 0.6933594;
      auVar30._12_4_ = 0.6933594;
      auVar30._0_4_ = 0.6933594;
      auVar30._4_4_ = 0.6933594;
      auVar30._16_4_ = 0.6933594;
      auVar30._20_4_ = 0.6933594;
      auVar30._24_4_ = 0.6933594;
      auVar30._28_4_ = 0.6933594;
      auVar5 = vfmadd213ps_fma(auVar30,_local_1260,auVar1);
      local_11e0 = auVar5._0_8_;
      local_860 = local_11e0;
      uStack_11d8 = auVar5._8_8_;
      uStack_858 = uStack_11d8;
      uStack_850 = 0;
      uStack_848 = 0;
      local_880 = local_1240._0_8_;
      uStack_878 = local_1240._8_8_;
      uStack_870 = local_1240._16_8_;
      uStack_868 = local_1240._24_8_;
      _local_12e0 = vorps_avx(ZEXT1632(auVar5),local_1240);
      local_14c0 = local_12e0;
      uStack_14b8 = uStack_12d8;
      uStack_14b0 = uStack_12d0;
      uStack_14a8 = uStack_12c8;
      local_13b0 = local_1450;
      local_13e0 = local_12e0;
      uStack_13d8 = uStack_12d8;
      uStack_13d0 = uStack_12d0;
      uStack_13c8 = uStack_12c8;
      *local_1450 = _local_12e0;
      local_1450 = local_1450 + 1;
      _local_11e0 = ZEXT1632(auVar5);
      local_1000 = uVar14;
      uStack_ff8 = uVar15;
      local_fc0 = local_fe0;
      uStack_fb8 = uStack_fd8;
      uStack_fb0 = uStack_fd0;
      uStack_fa8 = uStack_fc8;
      local_f08 = local_f30;
      local_ef8 = local_f10;
      local_ef0 = local_f30;
      local_ee0 = local_f10;
      local_ed8 = local_f30;
      local_ec8 = local_f10;
      local_ec0 = local_f30;
      local_eb0 = local_f10;
      local_ea8 = local_f30;
      local_e98 = local_f10;
      local_e90 = local_f30;
      local_e80 = local_f10;
      local_e78 = local_f30;
      local_e68 = local_f10;
      local_e60 = local_f30;
      local_e58 = local_f30;
      local_e40 = uVar16;
      uStack_e38 = uVar17;
      local_e00 = local_12a0._0_8_;
      uStack_df8 = local_12a0._8_8_;
      uStack_df0 = local_12a0._16_8_;
      uStack_de8 = local_12a0._24_8_;
      local_de0 = uVar10;
      uStack_dd8 = uVar11;
      uStack_dd0 = uVar12;
      uStack_dc8 = uVar13;
      local_da0 = uVar6;
      uStack_d98 = uVar7;
      uStack_d90 = uVar8;
      uStack_d88 = uVar9;
    }
    for (; local_1338 = local_13f0, local_1478 = local_1388, local_149c + 3 < local_1444;
        local_149c = local_149c + 4) {
      local_13a8 = local_1450;
      local_4a0 = *(undefined8 *)*local_1450;
      uStack_498 = *(undefined8 *)(*local_1450 + 8);
      local_12f8 = local_1429;
      local_1300 = &local_14d0;
      local_5f0 = 0x3f8000003f800000;
      uStack_5e8 = 0x3f8000003f800000;
      local_c0 = 0;
      local_520._8_8_ = SUB168(ZEXT816(0),4);
      uStack_b8 = local_520._8_8_;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_520._8_8_;
      local_600 = vcmpps_avx(*(undefined1 (*) [16])*local_1450,auVar53 << 0x40,2);
      local_4b0 = 0x80000000800000;
      uStack_4a8 = 0x80000000800000;
      auVar37._8_8_ = 0x80000000800000;
      auVar37._0_8_ = 0x80000000800000;
      auVar5 = vmaxps_avx(*(undefined1 (*) [16])*local_1450,auVar37);
      local_5d0 = auVar5._0_8_;
      local_a0 = local_5d0;
      uStack_5c8 = auVar5._8_8_;
      uStack_98 = uStack_5c8;
      local_f0 = local_5d0;
      uStack_e8 = uStack_5c8;
      local_f4 = 0x17;
      auVar4 = vpsrld_avx(auVar5,ZEXT416(0x17));
      local_570 = local_5d0;
      uStack_568 = uStack_5c8;
      local_580 = 0x807fffff807fffff;
      uStack_578 = 0x807fffff807fffff;
      auVar34._8_8_ = 0x807fffff807fffff;
      auVar34._0_8_ = 0x807fffff807fffff;
      auVar5 = vpand_avx(auVar5,auVar34);
      local_5d0 = auVar5._0_8_;
      local_60 = local_5d0;
      uStack_5c8 = auVar5._8_8_;
      uStack_58 = uStack_5c8;
      local_70 = 0x3f0000003f000000;
      uStack_68 = 0x3f0000003f000000;
      auVar50._8_8_ = 0x3f0000003f000000;
      auVar50._0_8_ = 0x3f0000003f000000;
      auVar3 = vpor_avx(auVar5,auVar50);
      local_5e0._0_8_ = auVar4._0_8_;
      local_d0 = local_5e0._0_8_;
      local_5e0._8_8_ = auVar4._8_8_;
      uStack_c8 = local_5e0._8_8_;
      local_e0 = 0x7f0000007f;
      uStack_d8 = 0x7f0000007f;
      auVar49._8_8_ = 0x7f0000007f;
      auVar49._0_8_ = 0x7f0000007f;
      local_5e0 = vpsubd_avx(auVar4,auVar49);
      local_430 = local_5e0._0_8_;
      uStack_428 = local_5e0._8_8_;
      auVar5 = vcvtdq2ps_avx(local_5e0);
      local_610 = auVar5._0_8_;
      uVar6 = local_610;
      uStack_608 = auVar5._8_8_;
      uVar7 = uStack_608;
      local_450 = 0x3f8000003f800000;
      uStack_448 = 0x3f8000003f800000;
      local_440._0_4_ = auVar5._0_4_;
      local_440._4_4_ = auVar5._4_4_;
      uStack_438._0_4_ = auVar5._8_4_;
      uStack_438._4_4_ = auVar5._12_4_;
      local_610._4_4_ = local_440._4_4_ + 1.0;
      local_610._0_4_ = (float)local_440 + 1.0;
      uStack_608._0_4_ = (float)uStack_438 + 1.0;
      uStack_608._4_4_ = uStack_438._4_4_ + 1.0;
      local_5d0 = auVar3._0_8_;
      local_40 = local_5d0;
      uStack_5c8 = auVar3._8_8_;
      uStack_38 = uStack_5c8;
      local_50 = 0x3f3504f33f3504f3;
      uStack_48 = 0x3f3504f33f3504f3;
      auVar51._8_8_ = 0x3f3504f33f3504f3;
      auVar51._0_8_ = 0x3f3504f33f3504f3;
      local_620 = vcmpps_avx(auVar3,auVar51,1);
      local_590 = local_5d0;
      uStack_588 = uStack_5c8;
      local_5a0 = local_620._0_8_;
      uStack_598 = local_620._8_8_;
      local_630 = vpand_avx(auVar3,local_620);
      local_530 = local_5d0;
      uStack_528 = uStack_5c8;
      local_540 = 0x3f8000003f800000;
      uStack_538 = 0x3f8000003f800000;
      auVar36._8_8_ = 0x3f8000003f800000;
      auVar36._0_8_ = 0x3f8000003f800000;
      auVar5 = vsubps_avx(auVar3,auVar36);
      local_550 = local_610;
      uStack_548 = uStack_608;
      local_5b0 = 0x3f8000003f800000;
      uStack_5a8 = 0x3f8000003f800000;
      local_5c0 = local_620._0_8_;
      uStack_5b8 = local_620._8_8_;
      auVar4._8_8_ = 0x3f8000003f800000;
      auVar4._0_8_ = 0x3f8000003f800000;
      local_560 = vpand_avx(auVar4,local_620);
      auVar35._8_8_ = uStack_608;
      auVar35._0_8_ = local_610;
      _local_610 = vsubps_avx(auVar35,local_560);
      local_5d0 = auVar5._0_8_;
      uVar8 = local_5d0;
      uStack_5c8 = auVar5._8_8_;
      uVar9 = uStack_5c8;
      local_460._0_4_ = auVar5._0_4_;
      local_460._4_4_ = auVar5._4_4_;
      uStack_458._0_4_ = auVar5._8_4_;
      uStack_458._4_4_ = auVar5._12_4_;
      local_470._0_4_ = local_630._0_4_;
      local_470._4_4_ = local_630._4_4_;
      uStack_468._0_4_ = local_630._8_4_;
      uStack_468._4_4_ = local_630._12_4_;
      local_5d0._0_4_ = (float)local_460 + (float)local_470;
      local_5d0._4_4_ = local_460._4_4_ + local_470._4_4_;
      uStack_458._0_4_ = (float)uStack_458 + (float)uStack_468;
      uStack_458._4_4_ = uStack_458._4_4_ + uStack_468._4_4_;
      uStack_5c8._0_4_ = (float)uStack_458;
      uStack_5c8._4_4_ = uStack_458._4_4_;
      local_4d0 = local_5d0;
      uStack_4c8 = uStack_5c8;
      local_640 = (float)local_5d0._0_4_ * (float)local_5d0._0_4_;
      fStack_63c = (float)local_5d0._4_4_ * (float)local_5d0._4_4_;
      fStack_638 = (float)uStack_458 * (float)uStack_458;
      fStack_634 = uStack_458._4_4_ * uStack_458._4_4_;
      uStack_648 = 0x3d9021bb3d9021bb;
      local_650 = (undefined1  [8])0x3d9021bb3d9021bb;
      local_418 = local_650;
      local_3c8 = local_5d0;
      local_328 = ::_ps_cephes_log_p1;
      local_2c0 = 0x3d9021bb3d9021bb;
      uStack_2b8 = 0x3d9021bb3d9021bb;
      local_2d0 = local_5d0;
      uStack_2c8 = uStack_5c8;
      local_2e0[0] = -0.1151461;
      local_2e0[1] = -0.1151461;
      afStack_2d8[0] = -0.1151461;
      afStack_2d8[1] = -0.1151461;
      auVar39._8_4_ = -0.1151461;
      auVar39._12_4_ = -0.1151461;
      auVar39._0_4_ = -0.1151461;
      auVar39._4_4_ = -0.1151461;
      auVar5 = vfmadd213ps_fma(_local_5d0,_local_650,auVar39);
      local_340 = ::_ps_cephes_log_p2;
      local_650 = auVar5._0_8_;
      local_290 = local_650;
      uStack_648 = auVar5._8_8_;
      uStack_288 = uStack_648;
      local_2a0 = local_5d0;
      uStack_298 = uStack_5c8;
      local_2b0[0] = 0.116769984;
      local_2b0[1] = 0.116769984;
      afStack_2a8[0] = 0.116769984;
      afStack_2a8[1] = 0.116769984;
      auVar40._8_4_ = 0.116769984;
      auVar40._12_4_ = 0.116769984;
      auVar40._0_4_ = 0.116769984;
      auVar40._4_4_ = 0.116769984;
      auVar5 = vfmadd213ps_fma(_local_5d0,auVar5,auVar40);
      local_358 = ::_ps_cephes_log_p3;
      local_650 = auVar5._0_8_;
      local_260 = local_650;
      uStack_648 = auVar5._8_8_;
      uStack_258 = uStack_648;
      local_270 = local_5d0;
      uStack_268 = uStack_5c8;
      local_280[0] = -0.12420141;
      local_280[1] = -0.12420141;
      afStack_278[0] = -0.12420141;
      afStack_278[1] = -0.12420141;
      auVar41._8_4_ = -0.12420141;
      auVar41._12_4_ = -0.12420141;
      auVar41._0_4_ = -0.12420141;
      auVar41._4_4_ = -0.12420141;
      auVar5 = vfmadd213ps_fma(_local_5d0,auVar5,auVar41);
      local_370 = ::_ps_cephes_log_p4;
      local_650 = auVar5._0_8_;
      local_230 = local_650;
      uStack_648 = auVar5._8_8_;
      uStack_228 = uStack_648;
      local_240 = local_5d0;
      uStack_238 = uStack_5c8;
      local_250[0] = 0.14249323;
      local_250[1] = 0.14249323;
      afStack_248[0] = 0.14249323;
      afStack_248[1] = 0.14249323;
      auVar42._8_4_ = 0.14249323;
      auVar42._12_4_ = 0.14249323;
      auVar42._0_4_ = 0.14249323;
      auVar42._4_4_ = 0.14249323;
      auVar5 = vfmadd213ps_fma(_local_5d0,auVar5,auVar42);
      local_388 = ::_ps_cephes_log_p5;
      local_650 = auVar5._0_8_;
      local_200 = local_650;
      uStack_648 = auVar5._8_8_;
      uStack_1f8 = uStack_648;
      local_210 = local_5d0;
      uStack_208 = uStack_5c8;
      local_220[0] = -0.16668057;
      local_220[1] = -0.16668057;
      afStack_218[0] = -0.16668057;
      afStack_218[1] = -0.16668057;
      auVar43._8_4_ = -0.16668057;
      auVar43._12_4_ = -0.16668057;
      auVar43._0_4_ = -0.16668057;
      auVar43._4_4_ = -0.16668057;
      auVar5 = vfmadd213ps_fma(_local_5d0,auVar5,auVar43);
      local_3a0 = ::_ps_cephes_log_p6;
      local_650 = auVar5._0_8_;
      local_1d0 = local_650;
      uStack_648 = auVar5._8_8_;
      uStack_1c8 = uStack_648;
      local_1e0 = local_5d0;
      uStack_1d8 = uStack_5c8;
      local_1f0[0] = 0.20000714;
      local_1f0[1] = 0.20000714;
      afStack_1e8[0] = 0.20000714;
      afStack_1e8[1] = 0.20000714;
      auVar44._8_4_ = 0.20000714;
      auVar44._12_4_ = 0.20000714;
      auVar44._0_4_ = 0.20000714;
      auVar44._4_4_ = 0.20000714;
      auVar5 = vfmadd213ps_fma(_local_5d0,auVar5,auVar44);
      local_3b8 = ::_ps_cephes_log_p7;
      local_650 = auVar5._0_8_;
      local_1a0 = local_650;
      uStack_648 = auVar5._8_8_;
      uStack_198 = uStack_648;
      local_1b0 = local_5d0;
      uStack_1a8 = uStack_5c8;
      local_1c0[0] = -0.24999994;
      local_1c0[1] = -0.24999994;
      afStack_1b8[0] = -0.24999994;
      afStack_1b8[1] = -0.24999994;
      auVar45._8_4_ = -0.24999994;
      auVar45._12_4_ = -0.24999994;
      auVar45._0_4_ = -0.24999994;
      auVar45._4_4_ = -0.24999994;
      auVar5 = vfmadd213ps_fma(_local_5d0,auVar5,auVar45);
      local_3d0 = ::_ps_cephes_log_p8;
      local_650 = auVar5._0_8_;
      local_170 = local_650;
      uStack_648 = auVar5._8_8_;
      uStack_168 = uStack_648;
      local_180 = local_5d0;
      uStack_178 = uStack_5c8;
      local_190[0] = 0.3333333;
      local_190[1] = 0.3333333;
      afStack_188[0] = 0.3333333;
      afStack_188[1] = 0.3333333;
      auVar46._8_4_ = 0.3333333;
      auVar46._12_4_ = 0.3333333;
      auVar46._0_4_ = 0.3333333;
      auVar46._4_4_ = 0.3333333;
      auVar5 = vfmadd213ps_fma(_local_5d0,auVar5,auVar46);
      local_650 = auVar5._0_8_;
      uVar10 = local_650;
      uStack_648 = auVar5._8_8_;
      uVar11 = uStack_648;
      local_4f0 = local_5d0;
      uStack_4e8 = uStack_5c8;
      local_4e0._0_4_ = auVar5._0_4_;
      local_4e0._4_4_ = auVar5._4_4_;
      uStack_4d8._0_4_ = auVar5._8_4_;
      uStack_4d8._4_4_ = auVar5._12_4_;
      local_650._4_4_ = local_4e0._4_4_ * (float)local_5d0._4_4_;
      local_650._0_4_ = (float)local_4e0 * (float)local_5d0._0_4_;
      uStack_648._0_4_ = (float)uStack_4d8 * (float)uStack_458;
      uStack_648._4_4_ = uStack_4d8._4_4_ * uStack_458._4_4_;
      local_500 = local_650;
      uStack_4f8 = uStack_648;
      local_510 = CONCAT44(fStack_63c,local_640);
      uStack_508 = CONCAT44(fStack_634,fStack_638);
      local_650._4_4_ = local_4e0._4_4_ * (float)local_5d0._4_4_ * fStack_63c;
      local_650._0_4_ = (float)local_4e0 * (float)local_5d0._0_4_ * local_640;
      uStack_648._0_4_ = (float)uStack_4d8 * (float)uStack_458 * fStack_638;
      uStack_648._4_4_ = uStack_4d8._4_4_ * uStack_458._4_4_ * fStack_634;
      local_3d8 = local_610;
      local_3e0 = ::_ps_cephes_log_q1;
      local_140 = local_610;
      uStack_138 = uStack_608;
      local_150[0] = -0.00021219444;
      local_150[1] = -0.00021219444;
      afStack_148[0] = -0.00021219444;
      afStack_148[1] = -0.00021219444;
      local_160 = local_650;
      uStack_158 = uStack_648;
      auVar47._8_4_ = -0.00021219444;
      auVar47._12_4_ = -0.00021219444;
      auVar47._0_4_ = -0.00021219444;
      auVar47._4_4_ = -0.00021219444;
      auVar5 = vfmadd213ps_fma(auVar47,_local_610,_local_650);
      local_408 = &local_640;
      local_410 = ::_ps_0p5;
      local_2f0 = CONCAT44(fStack_63c,local_640);
      uStack_2e8 = CONCAT44(fStack_634,fStack_638);
      auVar52._4_4_ = fStack_63c;
      auVar52._0_4_ = local_640;
      auVar52._8_4_ = fStack_638;
      auVar52._12_4_ = fStack_634;
      local_300[0] = 0.5;
      local_300[1] = 0.5;
      afStack_2f8[0] = 0.5;
      afStack_2f8[1] = 0.5;
      local_650 = auVar5._0_8_;
      local_310 = local_650;
      uStack_648 = auVar5._8_8_;
      uStack_308 = uStack_648;
      auVar38._8_4_ = 0.5;
      auVar38._12_4_ = 0.5;
      auVar38._0_4_ = 0.5;
      auVar38._4_4_ = 0.5;
      _local_650 = vfmadd213ps_fma(auVar38,auVar52 ^ _DAT_01f92600,auVar5);
      local_480 = local_5d0;
      uStack_478 = uStack_5c8;
      local_490._0_4_ = local_650._0_4_;
      local_490._4_4_ = local_650._4_4_;
      uStack_488._0_4_ = local_650._8_4_;
      uStack_488._4_4_ = local_650._12_4_;
      local_5d0._4_4_ = (float)local_5d0._4_4_ + local_490._4_4_;
      local_5d0._0_4_ = (float)local_5d0._0_4_ + (float)local_490;
      uStack_5c8._0_4_ = (float)uStack_458 + (float)uStack_488;
      uStack_5c8._4_4_ = uStack_458._4_4_ + uStack_488._4_4_;
      local_3f0 = local_610;
      local_3f8 = ::_ps_cephes_log_q2;
      local_400 = local_5d0;
      local_110 = local_610;
      uStack_108 = uStack_608;
      local_120[0] = 0.6933594;
      local_120[1] = 0.6933594;
      afStack_118[0] = 0.6933594;
      afStack_118[1] = 0.6933594;
      local_130 = local_5d0;
      uStack_128 = uStack_5c8;
      auVar48._8_4_ = 0.6933594;
      auVar48._12_4_ = 0.6933594;
      auVar48._0_4_ = 0.6933594;
      auVar48._4_4_ = 0.6933594;
      auVar5 = vfmadd213ps_fma(auVar48,_local_610,_local_5d0);
      local_5d0 = auVar5._0_8_;
      local_80 = local_5d0;
      uStack_5c8 = auVar5._8_8_;
      uStack_78 = uStack_5c8;
      local_90 = local_600._0_8_;
      uStack_88 = local_600._8_8_;
      _local_5d0 = vpor_avx(auVar5,local_600);
      local_14d0 = local_5d0;
      uStack_14c8 = uStack_5c8;
      local_1390 = local_1450;
      local_13a0 = local_5d0;
      uStack_1398 = uStack_5c8;
      *(undefined1 (*) [16])*local_1450 = _local_5d0;
      local_1450 = (undefined1 (*) [32])(*local_1450 + 0x10);
      local_520 = ZEXT816(0) << 0x20;
      local_4e0 = uVar10;
      uStack_4d8 = uVar11;
      local_4c0 = local_4d0;
      uStack_4b8 = uStack_4c8;
      local_490 = local_650;
      uStack_488 = uStack_648;
      local_470 = local_630._0_8_;
      uStack_468 = local_630._8_8_;
      local_460 = uVar8;
      uStack_458 = uVar9;
      local_440 = uVar6;
      uStack_438 = uVar7;
      local_3e8 = local_418;
      local_3c0 = local_418;
      local_3b0 = local_3c8;
      local_3a8 = local_418;
      local_398 = local_3c8;
      local_390 = local_418;
      local_380 = local_3c8;
      local_378 = local_418;
      local_368 = local_3c8;
      local_360 = local_418;
      local_350 = local_3c8;
      local_348 = local_418;
      local_338 = local_3c8;
      local_330 = local_418;
      local_320 = local_3c8;
      local_318 = local_418;
      local_b0 = local_4a0;
      uStack_a8 = uStack_498;
    }
    for (; local_149c < local_1444; local_149c = local_149c + 1) {
      local_12e8 = local_1429;
      local_12f0 = local_1450;
      fVar55 = logf(*(float *)*local_1450);
      *(float *)*local_1450 = fVar55;
      local_1450 = (undefined1 (*) [32])(*local_1450 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}